

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagepattern.cpp
# Opt level: O3

UBool __thiscall
icu_63::MessagePatternList<icu_63::MessagePattern::Part,_32>::equals
          (MessagePatternList<icu_63::MessagePattern::Part,_32> *this,
          MessagePatternList<icu_63::MessagePattern::Part,_32> *other,int32_t length)

{
  ulong uVar1;
  UBool UVar2;
  ulong uVar3;
  Part *this_00;
  Part *other_00;
  bool bVar4;
  
  if (length < 1) {
    return '\x01';
  }
  this_00 = (this->a).ptr;
  other_00 = (other->a).ptr;
  UVar2 = MessagePattern::Part::operator==(this_00,other_00);
  if (UVar2 == '\0') {
    bVar4 = false;
  }
  else {
    uVar1 = 1;
    do {
      uVar3 = uVar1;
      other_00 = other_00 + 1;
      this_00 = this_00 + 1;
      if ((uint)length == uVar3) break;
      UVar2 = MessagePattern::Part::operator==(this_00,other_00);
      uVar1 = uVar3 + 1;
    } while (UVar2 != '\0');
    bVar4 = (uint)length <= uVar3;
  }
  return bVar4;
}

Assistant:

UBool equals(const MessagePatternList<T, stackCapacity> &other, int32_t length) const {
        for(int32_t i=0; i<length; ++i) {
            if(a[i]!=other.a[i]) { return FALSE; }
        }
        return TRUE;
    }